

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_Shutdown(void)

{
  ImGuiContext *pIVar1;
  ImGuiIO *pIVar2;
  undefined8 *ptr;
  long lVar3;
  
  pIVar1 = ImGui::GetCurrentContext();
  if (pIVar1 == (ImGuiContext *)0x0) {
    ptr = (undefined8 *)0x0;
  }
  else {
    pIVar2 = ImGui::GetIO();
    ptr = (undefined8 *)pIVar2->BackendPlatformUserData;
  }
  pIVar2 = ImGui::GetIO();
  if (*(char *)(ptr + 0xe) == '\x01') {
    ImGui_ImplGlfw_RestoreCallbacks((GLFWwindow *)*ptr);
  }
  lVar3 = 4;
  do {
    glfwDestroyCursor((GLFWcursor *)ptr[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xd);
  pIVar2->BackendPlatformName = (char *)0x0;
  pIVar2->BackendPlatformUserData = (void *)0x0;
  if (ptr != (undefined8 *)0x0) {
    ImGui::MemFree(ptr);
    return;
  }
  return;
}

Assistant:

static ImGui_ImplGlfw_Data* ImGui_ImplGlfw_GetBackendData()
{
    return ImGui::GetCurrentContext() ? (ImGui_ImplGlfw_Data*)ImGui::GetIO().BackendPlatformUserData : nullptr;
}